

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

uint * __thiscall r_code::vector<unsigned_int>::operator[](vector<unsigned_int> *this,size_t i)

{
  pointer puVar1;
  
  if ((ulong)((long)(this->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) <= i) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_vector,i + 1);
  }
  puVar1 = (this->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (i < (ulong)((long)(this->m_vector).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    return puVar1 + i;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i);
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }